

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtosc.c
# Opt level: O0

_Bool rtosc_valid_message_p(char *msg,size_t len)

{
  ushort **ppuVar1;
  long lVar2;
  char *msg_00;
  size_t sVar3;
  ulong in_RSI;
  char *in_RDI;
  size_t observed_length;
  size_t offset2;
  size_t offset1;
  uint i;
  char *tmp;
  ulong local_38;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar4;
  _Bool local_1;
  
  if (*in_RDI == '/') {
    uVar4 = 0;
    for (msg_00 = in_RDI; (uVar4 < in_RSI && (*msg_00 != '\0')); msg_00 = msg_00 + 1) {
      ppuVar1 = __ctype_b_loc();
      if (((*ppuVar1)[(int)*msg_00] & 0x4000) == 0) {
        return false;
      }
      uVar4 = uVar4 + 1;
    }
    lVar2 = (long)msg_00 - (long)in_RDI;
    local_38 = (long)msg_00 - (long)in_RDI;
    for (; (local_38 < in_RSI && (*msg_00 != ',')); msg_00 = msg_00 + 1) {
      local_38 = local_38 + 1;
    }
    if (local_38 - lVar2 < 5) {
      if ((local_38 & 3) == 0) {
        sVar3 = rtosc_message_length(msg_00,CONCAT44(uVar4,in_stack_ffffffffffffffd8));
        local_1 = sVar3 == in_RSI;
      }
      else {
        local_1 = false;
      }
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool rtosc_valid_message_p(const char *msg, size_t len)
{
    //Validate Path Characters (assumes printable characters are sufficient)
    if(*msg != '/')
        return false;
    const char *tmp = msg;
    for(unsigned i=0; i<len; ++i) {
        if(*tmp == 0)
            break;
        if(!isprint(*tmp))
            return false;
        tmp++;
    }

    //tmp is now either pointing to a null or the end of the string
    const size_t offset1 = tmp-msg;
    size_t       offset2 = tmp-msg;
    for(; offset2<len; offset2++) {
        if(*tmp == ',')
            break;
        tmp++;
    }

    //Too many NULL bytes
    if(offset2-offset1 > 4)
        return false;

    if((offset2 % 4) != 0)
        return false;

    size_t observed_length = rtosc_message_length(msg, len);
    return observed_length == len;
}